

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exttpose.cc
# Opt level: O3

int cmp2it(void *a,void *b)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if ((*b <= *a) && (uVar1 = 1, *a <= *b)) {
    uVar1 = 0xffffffff;
    if (*(int *)((long)b + 4) <= *(int *)((long)a + 4)) {
      uVar1 = (uint)(*(int *)((long)b + 4) < *(int *)((long)a + 4));
    }
  }
  return uVar1;
}

Assistant:

int cmp2it(const void *a, const void *b) {
    auto *ary = (int *) a;
    auto *bry = (int *) b;
    if (ary[0] < bry[0]) return -1;
    else if (ary[0] > bry[0]) return 1;
    else {
        if (ary[1] < bry[1]) return -1;
        else if (ary[1] > bry[1]) return 1;
        else return 0;
    }
}